

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_peread.c
# Opt level: O0

int load_optional_header32
              (dwarf_pe_object_access_internals_t *pep,Dwarf_Unsigned offset,int *errcode)

{
  int iVar1;
  char local_10c [2];
  uchar local_10a;
  uchar local_109;
  undefined1 auStack_108 [4];
  IMAGE_OPTIONAL_HEADER32_dw hdr;
  int res;
  int *errcode_local;
  Dwarf_Unsigned offset_local;
  dwarf_pe_object_access_internals_t *pep_local;
  
  hdr.DataDirectory[0xf].VirtualAddress[0] = '\0';
  hdr.DataDirectory[0xf].VirtualAddress[1] = '\0';
  hdr.DataDirectory[0xf].VirtualAddress[2] = '\0';
  hdr.DataDirectory[0xf].VirtualAddress[3] = '\0';
  pep->pe_optional_header_size = 0xe0;
  if (pep->pe_filesize < pep->pe_optional_header_size + offset) {
    *errcode = 0x1a7;
    pep_local._4_1_ = '\x01';
    pep_local._5_1_ = '\0';
    pep_local._6_1_ = '\0';
    pep_local._7_1_ = '\0';
  }
  else {
    unique0x10000252 = errcode;
    hdr.DataDirectory[0xf].VirtualAddress =
         (char  [4])
         _dwarf_object_read_random(pep->pe_fd,local_10c,offset,0xe0,pep->pe_filesize,errcode);
    pep_local._4_4_ = hdr.DataDirectory[0xf].VirtualAddress;
    if (hdr.DataDirectory[0xf].VirtualAddress == (char  [4])0x0) {
      (pep->pe_OptionalHeader).Magic = 0;
      (*pep->pe_copy_word)(&pep->pe_OptionalHeader,local_10c,2);
      (pep->pe_OptionalHeader).MajorLinkerVersion = local_10a;
      (pep->pe_OptionalHeader).MinorLinkerVersion = local_109;
      (pep->pe_OptionalHeader).ImageBase = 0;
      (*pep->pe_copy_word)(&(pep->pe_OptionalHeader).ImageBase,hdr.BaseOfCode,4);
      (pep->pe_OptionalHeader).SizeOfCode = 0;
      (*pep->pe_copy_word)(&(pep->pe_OptionalHeader).SizeOfCode,auStack_108,4);
      (pep->pe_OptionalHeader).SizeOfImage = 0;
      (*pep->pe_copy_word)(&(pep->pe_OptionalHeader).SizeOfImage,hdr.MajorSubsystemVersion,4);
      (pep->pe_OptionalHeader).SizeOfHeaders = 0;
      (*pep->pe_copy_word)(&(pep->pe_OptionalHeader).SizeOfHeaders,hdr.Win32VersionValue,4);
      (pep->pe_OptionalHeader).SizeOfDataDirEntry = 8;
      pep_local._4_1_ = '\0';
      pep_local._5_1_ = '\0';
      pep_local._6_1_ = '\0';
      pep_local._7_1_ = '\0';
    }
  }
  iVar1._0_1_ = pep_local._4_1_;
  iVar1._1_1_ = pep_local._5_1_;
  iVar1._2_1_ = pep_local._6_1_;
  iVar1._3_1_ = pep_local._7_1_;
  return iVar1;
}

Assistant:

static int
load_optional_header32(dwarf_pe_object_access_internals_t *pep,
    Dwarf_Unsigned offset, int*errcode)
{
    int res = 0;
    IMAGE_OPTIONAL_HEADER32_dw hdr;

    pep->pe_optional_header_size = sizeof(IMAGE_OPTIONAL_HEADER32_dw);

    if ((pep->pe_optional_header_size + offset) >
        pep->pe_filesize) {
        *errcode = DW_DLE_FILE_TOO_SMALL;
        return DW_DLV_ERROR;
    }

    res =  _dwarf_object_read_random(pep->pe_fd,
        (char *)&hdr,
        offset, sizeof(IMAGE_OPTIONAL_HEADER32_dw),
        pep->pe_filesize,
        errcode);
    if (res != DW_DLV_OK) {
        return res;
    }

    /* This is a subset of fields. */
    ASNAR(pep->pe_copy_word,pep->pe_OptionalHeader.Magic,
        hdr.Magic);
    pep->pe_OptionalHeader.MajorLinkerVersion= hdr.MajorLinkerVersion;
    pep->pe_OptionalHeader.MinorLinkerVersion= hdr.MinorLinkerVersion;
    ASNAR(pep->pe_copy_word,pep->pe_OptionalHeader.ImageBase,
        hdr.ImageBase);
    ASNAR(pep->pe_copy_word,pep->pe_OptionalHeader.SizeOfCode,
        hdr.SizeOfCode);
    ASNAR(pep->pe_copy_word,pep->pe_OptionalHeader.SizeOfImage,
        hdr.SizeOfImage);
    ASNAR(pep->pe_copy_word,pep->pe_OptionalHeader.SizeOfHeaders,
        hdr.SizeOfHeaders);
    pep->pe_OptionalHeader.SizeOfDataDirEntry =
        sizeof(IMAGE_DATA_DIRECTORY_dw);
    return DW_DLV_OK;
}